

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_widget_is_hovered(nk_context *ctx)

{
  float fVar1;
  uint uVar2;
  nk_rect bounds;
  nk_rect local_18;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x48a3,"int nk_widget_is_hovered(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    nk_layout_peek(&local_18,ctx);
    uVar2 = 0;
    if (ctx->active == ctx->current) {
      fVar1 = (ctx->input).mouse.pos.x;
      if ((local_18.x <= fVar1) && (fVar1 <= local_18.x + local_18.w)) {
        fVar1 = (ctx->input).mouse.pos.y;
        if (local_18.y <= fVar1) {
          uVar2 = (uint)(fVar1 <= local_18.y + local_18.h);
        }
      }
    }
    return uVar2;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x48a4,"int nk_widget_is_hovered(struct nk_context *)");
}

Assistant:

NK_API int
nk_widget_is_hovered(struct nk_context *ctx)
{
    int ret;
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current)
        return 0;

    nk_layout_peek(&bounds, ctx);
    ret = (ctx->active == ctx->current);
    ret = ret && nk_input_is_mouse_hovering_rect(&ctx->input, bounds);
    return ret;
}